

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O0

int QtMWidgets::FingerGeometry::longTouchBounce(void)

{
  int iVar1;
  int *piVar2;
  int local_20 [5];
  int local_c;
  
  if (longTouchBounce()::bounce == '\0') {
    iVar1 = __cxa_guard_acquire(&longTouchBounce()::bounce);
    if (iVar1 != 0) {
      local_c = height();
      local_20[0] = width();
      piVar2 = qMax<int>(&local_c,local_20);
      longTouchBounce::bounce = qRound((double)*piVar2 * 0.6);
      __cxa_guard_release(&longTouchBounce()::bounce);
    }
  }
  return longTouchBounce::bounce;
}

Assistant:

int
FingerGeometry::longTouchBounce()
{
	static const int bounce = qRound(
		(qreal) qMax( FingerGeometry::height(), FingerGeometry::width() ) * 0.6 );

	return bounce;
}